

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall sfc::Image::save(Image *this,string *path)

{
  uint uVar1;
  char *pcVar2;
  runtime_error *this_00;
  allocator<char> local_41;
  string local_40;
  uint local_1c;
  string *psStack_18;
  uint error;
  string *path_local;
  Image *this_local;
  
  psStack_18 = path;
  path_local = (string *)this;
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (path);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pcVar2,&local_41);
  uVar1 = lodepng::encode(&local_40,&this->_data,this->_width,this->_height,LCT_RGBA,8);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (uVar1 != 0) {
    local_1c = uVar1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar2 = lodepng_error_text(local_1c);
    std::runtime_error::runtime_error(this_00,pcVar2);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void Image::save(const std::string& path) const {
  unsigned error = lodepng::encode(path.c_str(), _data, _width, _height, LCT_RGBA, 8);
  if (error)
    throw std::runtime_error(lodepng_error_text(error));
}